

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O0

int big_record_view_field(BigRecordType *rtype,int i,BigArray *array,size_t size,void *buf)

{
  int iVar1;
  size_t local_58;
  ptrdiff_t strides [2];
  size_t dims [2];
  char *p;
  void *buf_local;
  size_t size_local;
  BigArray *array_local;
  int i_local;
  BigRecordType *rtype_local;
  
  local_58 = rtype->itemsize;
  strides[0] = (ptrdiff_t)rtype->fields[i].elsize;
  strides[1] = size;
  iVar1 = big_array_init(array,(void *)((long)buf + (long)rtype->fields[i].offset),
                         rtype->fields[i].dtype,2,(size_t *)(strides + 1),(ptrdiff_t *)&local_58);
  return iVar1;
}

Assistant:

int
big_record_view_field(const BigRecordType * rtype,
    int i,
    BigArray * array,
    size_t size,
    void * buf
)
{
    char * p = buf;
    size_t dims[2] = { size, rtype->fields[i].nmemb };
    ptrdiff_t strides[2] = { rtype->itemsize, rtype->fields[i].elsize };
    return big_array_init(array, &p[rtype->fields[i].offset],
                          rtype->fields[i].dtype,
                          2, dims, strides);
}